

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem1.cpp
# Opt level: O3

int main(void)

{
  std::ios_base::sync_with_stdio(false);
  *(undefined8 *)(*(long *)(std::cin + -0x18) + 0x105178) = 0;
  *(undefined8 *)(*(long *)(std::cout + -0x18) + 0x105138) = 0;
  problem_code();
  return 0;
}

Assistant:

int main(){
    ios_base::sync_with_stdio(0);
    cin.tie(0); cout.tie(0);
    // freopen("input.txt", "r", stdin);
    // freopen("output.txt", "w", stdout);

    //int testcase; cin >> testcase;
    //for (int t = 0; t < testcase; ++t)
        problem_code();
}